

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void google::protobuf::compiler::CodeGeneratorRequest::SharedDtor(MessageLite *self)

{
  Version *this;
  ulong uVar1;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&self->_internal_metadata_);
  }
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 6));
    this = (Version *)self[6]._internal_metadata_.ptr_;
    if (this != (Version *)0x0) {
      Version::~Version(this);
      operator_delete(this,0x30);
    }
    RepeatedPtrField<google::protobuf::FileDescriptorProto>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::FileDescriptorProto> *)
               &self[4]._internal_metadata_);
    RepeatedPtrField<google::protobuf::FileDescriptorProto>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::FileDescriptorProto> *)(self + 3));
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&self[1]._internal_metadata_);
    return;
  }
  SharedDtor((CodeGeneratorRequest *)&stack0xffffffffffffffe0);
}

Assistant:

inline void CodeGeneratorRequest::SharedDtor(MessageLite& self) {
  CodeGeneratorRequest& this_ = static_cast<CodeGeneratorRequest&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.parameter_.Destroy();
  delete this_._impl_.compiler_version_;
  this_._impl_.~Impl_();
}